

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O1

utf8proc_ssize_t
utf8proc_normalize_utf32(utf8proc_int32_t *buffer,utf8proc_ssize_t length,utf8proc_option_t options)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint *puVar4;
  ushort uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ushort uVar10;
  int iVar11;
  long lVar12;
  utf8proc_property_t *puVar13;
  
  lVar9 = length;
  if ((options & (UTF8PROC_STRIPCC|UTF8PROC_NLF2LF)) != 0) {
    if (length < 1) {
      lVar9 = 0;
    }
    else {
      lVar7 = 0;
      lVar9 = 0;
      do {
        iVar11 = buffer[lVar7];
        if ((lVar7 < length + -1 && iVar11 == 0xd) && (buffer[lVar7 + 1] == 10)) {
          lVar7 = lVar7 + 1;
        }
        if ((((iVar11 == 10) || (iVar11 == 0xd)) || (iVar11 == 0x85)) ||
           (((options >> 9 & 1) != 0 && (iVar11 - 0xbU < 2)))) {
          lVar12 = lVar9 + 1;
          if ((char)options < '\0') {
            if ((options >> 8 & 1) == 0) {
              buffer[lVar9] = 0x2028;
              lVar9 = lVar12;
            }
            else {
              buffer[lVar9] = 10;
              lVar9 = lVar12;
            }
          }
          else if ((options >> 8 & 1) == 0) {
            buffer[lVar9] = 0x20;
            lVar9 = lVar12;
          }
          else {
            buffer[lVar9] = 0x2029;
            lVar9 = lVar12;
          }
        }
        else {
          if (((options >> 9 & 1) == 0) || (0x20 < iVar11 - 0x7fU && 0x1f < iVar11)) {
            buffer[lVar9] = iVar11;
          }
          else {
            if (iVar11 != 9) goto LAB_00135ed3;
            buffer[lVar9] = 0x20;
          }
          lVar9 = lVar9 + 1;
        }
LAB_00135ed3:
        lVar7 = lVar7 + 1;
      } while (lVar7 < length);
    }
  }
  lVar7 = lVar9;
  if (((options & UTF8PROC_COMPOSE) == 0) || (lVar7 = 0, lVar9 < 1)) {
    return lVar7;
  }
  uVar5 = 0xffff;
  puVar4 = (uint *)0x0;
  puVar13 = (utf8proc_property_t *)0x0;
  lVar12 = 0;
  do {
    uVar3 = buffer[lVar12];
    uVar1 = utf8proc_stage2table[(uVar3 & 0xff) + (uint)utf8proc_stage1table[(int)uVar3 >> 8]];
    if ((puVar4 == (uint *)0x0) || (utf8proc_properties[uVar1].combining_class <= (short)uVar5)) {
LAB_001360ce:
      buffer[lVar7] = uVar3;
      uVar1 = utf8proc_properties[uVar1].combining_class;
      uVar10 = uVar1;
      if ((short)uVar1 <= (short)uVar5) {
        uVar10 = uVar5;
      }
      uVar5 = -(ushort)(uVar1 == 0) | uVar10;
      if (uVar1 == 0) {
        puVar13 = (utf8proc_property_t *)0x0;
        puVar4 = (uint *)(buffer + lVar7);
      }
      lVar7 = lVar7 + 1;
    }
    else {
      if ((*puVar4 - 0x1100 < 0x13) && (0xffffffea < uVar3 - 0x1176)) {
        *puVar4 = (*puVar4 * 0x15 + uVar3) * 0x1c - 0x28469c;
        iVar11 = 7;
        puVar13 = (utf8proc_property_t *)0x0;
      }
      else {
        uVar6 = *puVar4;
        if (((uVar6 - 0xac00 < 0x2ba4) && (uVar6 + ((uVar6 - 0xac00) / 0x1c) * -0x1c == 0xac00)) &&
           (0xffffffe3 < uVar3 - 0x11c3)) {
          *puVar4 = (uVar3 + uVar6) - 0x11a7;
          iVar11 = 7;
          puVar13 = (utf8proc_property_t *)0x0;
        }
        else {
          if (puVar13 == (utf8proc_property_t *)0x0) {
            puVar13 = utf8proc_properties +
                      utf8proc_stage2table
                      [(*puVar4 & 0xff) + (uint)utf8proc_stage1table[(int)*puVar4 >> 8]];
          }
          uVar10 = puVar13->comb_index;
          iVar11 = 0;
          if (-1 < (short)uVar10) {
            uVar2 = utf8proc_properties[uVar1].comb_index;
            if ((short)uVar2 < -1) {
              uVar6 = uVar2 & 0x3fff;
              if ((uVar6 < utf8proc_combinations[uVar10]) ||
                 (utf8proc_combinations[(ulong)uVar10 + 1] < uVar6)) {
                iVar11 = 0;
              }
              else {
                lVar8 = ((ulong)(uVar6 + uVar10) + 2) - (ulong)utf8proc_combinations[uVar10];
                uVar6 = (uint)utf8proc_combinations[lVar8];
                iVar11 = 0;
                if ((uVar2 >> 0xe & 1) != 0) {
                  uVar6 = CONCAT22(utf8proc_combinations[lVar8],
                                   utf8proc_combinations[(long)(int)lVar8 + 1]);
                }
                if ((0 < (int)uVar6) &&
                   (((options & UTF8PROC_STABLE) == 0 ||
                    ((utf8proc_properties
                      [utf8proc_stage2table[(uVar6 & 0xff) + (uint)utf8proc_stage1table[uVar6 >> 8]]
                      ].field_0x14 & 2) == 0)))) {
                  *puVar4 = uVar6;
                  iVar11 = 7;
                  puVar13 = (utf8proc_property_t *)0x0;
                }
              }
            }
          }
        }
      }
      if (iVar11 == 0) goto LAB_001360ce;
    }
    lVar12 = lVar12 + 1;
    if (lVar9 == lVar12) {
      return lVar7;
    }
  } while( true );
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_normalize_utf32(utf8proc_int32_t *buffer, utf8proc_ssize_t length, utf8proc_option_t options) {
  /* UTF8PROC_NULLTERM option will be ignored, 'length' is never ignored */
  if (options & (UTF8PROC_NLF2LS | UTF8PROC_NLF2PS | UTF8PROC_STRIPCC)) {
    utf8proc_ssize_t rpos;
    utf8proc_ssize_t wpos = 0;
    utf8proc_int32_t uc;
    for (rpos = 0; rpos < length; rpos++) {
      uc = buffer[rpos];
      if (uc == 0x000D && rpos < length-1 && buffer[rpos+1] == 0x000A) rpos++;
      if (uc == 0x000A || uc == 0x000D || uc == 0x0085 ||
          ((options & UTF8PROC_STRIPCC) && (uc == 0x000B || uc == 0x000C))) {
        if (options & UTF8PROC_NLF2LS) {
          if (options & UTF8PROC_NLF2PS) {
            buffer[wpos++] = 0x000A;
          } else {
            buffer[wpos++] = 0x2028;
          }
        } else {
          if (options & UTF8PROC_NLF2PS) {
            buffer[wpos++] = 0x2029;
          } else {
            buffer[wpos++] = 0x0020;
          }
        }
      } else if ((options & UTF8PROC_STRIPCC) &&
          (uc < 0x0020 || (uc >= 0x007F && uc < 0x00A0))) {
        if (uc == 0x0009) buffer[wpos++] = 0x0020;
      } else {
        buffer[wpos++] = uc;
      }
    }
    length = wpos;
  }
  if (options & UTF8PROC_COMPOSE) {
    utf8proc_int32_t *starter = NULL;
    utf8proc_int32_t current_char;
    const utf8proc_property_t *starter_property = NULL, *current_property;
    utf8proc_propval_t max_combining_class = -1;
    utf8proc_ssize_t rpos;
    utf8proc_ssize_t wpos = 0;
    utf8proc_int32_t composition;
    for (rpos = 0; rpos < length; rpos++) {
      current_char = buffer[rpos];
      current_property = unsafe_get_property(current_char);
      if (starter && current_property->combining_class > max_combining_class) {
        /* combination perhaps possible */
        utf8proc_int32_t hangul_lindex;
        utf8proc_int32_t hangul_sindex;
        hangul_lindex = *starter - UTF8PROC_HANGUL_LBASE;
        if (hangul_lindex >= 0 && hangul_lindex < UTF8PROC_HANGUL_LCOUNT) {
          utf8proc_int32_t hangul_vindex;
          hangul_vindex = current_char - UTF8PROC_HANGUL_VBASE;
          if (hangul_vindex >= 0 && hangul_vindex < UTF8PROC_HANGUL_VCOUNT) {
            *starter = UTF8PROC_HANGUL_SBASE +
              (hangul_lindex * UTF8PROC_HANGUL_VCOUNT + hangul_vindex) *
              UTF8PROC_HANGUL_TCOUNT;
            starter_property = NULL;
            continue;
          }
        }
        hangul_sindex = *starter - UTF8PROC_HANGUL_SBASE;
        if (hangul_sindex >= 0 && hangul_sindex < UTF8PROC_HANGUL_SCOUNT &&
            (hangul_sindex % UTF8PROC_HANGUL_TCOUNT) == 0) {
          utf8proc_int32_t hangul_tindex;
          hangul_tindex = current_char - UTF8PROC_HANGUL_TBASE;
          if (hangul_tindex >= 0 && hangul_tindex < UTF8PROC_HANGUL_TCOUNT) {
            *starter += hangul_tindex;
            starter_property = NULL;
            continue;
          }
        }
        if (!starter_property) {
          starter_property = unsafe_get_property(*starter);
        }
        if (starter_property->comb_index < 0x8000 &&
            current_property->comb_index != UINT16_MAX &&
            current_property->comb_index >= 0x8000) {
          int sidx = starter_property->comb_index;
          int idx = current_property->comb_index & 0x3FFF;
          if (idx >= utf8proc_combinations[sidx] && idx <= utf8proc_combinations[sidx + 1] ) {
            idx += sidx + 2 - utf8proc_combinations[sidx];
            if (current_property->comb_index & 0x4000) {
              composition = (utf8proc_combinations[idx] << 16) | utf8proc_combinations[idx+1];
            } else
              composition = utf8proc_combinations[idx];

            if (composition > 0 && (!(options & UTF8PROC_STABLE) ||
                !(unsafe_get_property(composition)->comp_exclusion))) {
              *starter = composition;
              starter_property = NULL;
              continue;
            }
          }
        }
      }
      buffer[wpos] = current_char;
      if (current_property->combining_class) {
        if (current_property->combining_class > max_combining_class) {
          max_combining_class = current_property->combining_class;
        }
      } else {
        starter = buffer + wpos;
        starter_property = NULL;
        max_combining_class = -1;
      }
      wpos++;
    }
    length = wpos;
  }
  return length;
}